

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O0

void coro_stack_free(coro_stack *stack)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  long *in_RDI;
  
  if (*in_RDI != 0) {
    lVar1 = *in_RDI;
    sVar3 = coro_pagesize();
    lVar2 = in_RDI[1];
    sVar4 = coro_pagesize();
    munmap((void *)(lVar1 + sVar3 * -4),lVar2 + sVar4 * 4);
  }
  return;
}

Assistant:

void
coro_stack_free (struct coro_stack *stack)
{
#if CORO_FIBER
  /* nop */
#else
  #if CORO_USE_VALGRIND
    VALGRIND_STACK_DEREGISTER (stack->valgrind_id);
  #endif

  #if CORO_MMAP
    if (stack->sptr)
      munmap ((void*)((char *)stack->sptr - CORO_GUARDPAGES * PAGESIZE),
              stack->ssze                 + CORO_GUARDPAGES * PAGESIZE);
  #else
    free (stack->sptr);
  #endif
#endif
}